

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  int col;
  long lVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  float fVar9;
  undefined8 uVar10;
  float fVar11;
  Matrix<float,_2,_4> res;
  float local_38 [4];
  float local_28 [4];
  undefined8 local_18;
  float fStack_10;
  float fStack_c;
  
  uVar8 = *(undefined8 *)(evalCtx->coords).m_data;
  fVar7 = (float)uVar8;
  fVar6 = (float)((ulong)uVar8 >> 0x20);
  if (in0Type != INPUTTYPE_DYNAMIC) {
    fVar6 = 0.5;
    fVar7 = 1.2;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    uVar8 = *(undefined8 *)(evalCtx->coords).m_data;
    uVar10 = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    uVar8 = 0xbf8000003e4ccccd;
    uVar10 = 0x3f4ccccd3f000000;
  }
  fVar9 = (float)((ulong)uVar8 >> 0x20);
  fVar11 = (float)((ulong)uVar10 >> 0x20);
  local_28[0] = fVar7 * (float)uVar8;
  local_28[1] = fVar7 * fVar9;
  local_28[3] = fVar7 * fVar11;
  local_28[2] = fVar7 * (float)uVar10;
  local_18._0_4_ = fVar6 * (float)uVar8;
  local_18._4_4_ = fVar6 * fVar9;
  fStack_10 = fVar6 * (float)uVar10;
  fStack_c = fVar6 * fVar11;
  lVar3 = 0;
  pfVar4 = (float *)&res;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar5 = 0;
    do {
      fVar7 = 1.0;
      if (lVar3 != lVar5) {
        fVar7 = 0.0;
      }
      pfVar4[lVar5 * 2] = fVar7;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar3 = 1;
    pfVar4 = res.m_data.m_data[0].m_data + 1;
    bVar1 = false;
  } while (bVar2);
  lVar3 = 0;
  do {
    uVar8 = *(undefined8 *)(local_28 + lVar3);
    uVar10 = *(undefined8 *)((long)&local_18 + lVar3 * 4);
    res.m_data.m_data[lVar3].m_data[0] = (float)uVar8;
    res.m_data.m_data[lVar3].m_data[1] = (float)uVar10;
    res.m_data.m_data[lVar3 + 1].m_data[0] = (float)((ulong)uVar8 >> 0x20);
    res.m_data.m_data[lVar3 + 1].m_data[1] = (float)((ulong)uVar10 >> 0x20);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 4);
  local_28[2] = 0.0;
  local_28[3] = 1.4013e-45;
  local_18._0_4_ = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_28[lVar3]] = local_38[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}